

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.hpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::~MismatchedTokenException(MismatchedTokenException *this)

{
  MismatchedTokenException *in_RDI;
  
  ~MismatchedTokenException(in_RDI);
  operator_delete(in_RDI,200);
  return;
}

Assistant:

~MismatchedTokenException() throw() {}